

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

ExecutionState __thiscall
Js::FunctionExecutionStateMachine::ModeToState
          (FunctionExecutionStateMachine *this,ExecutionMode mode)

{
  code *pcVar1;
  ExecutionState EVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (mode < Count) {
    EVar2 = (ExecutionState)(0x604020100 >> ((mode & (FullJit|SimpleJit)) << 3));
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x1c0,"(!\"Unexpected ExecutionMode for ExecutionState\")",
                                "!\"Unexpected ExecutionMode for ExecutionState\"");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    EVar2 = Interpreter;
  }
  return EVar2;
}

Assistant:

FunctionExecutionStateMachine::ExecutionState FunctionExecutionStateMachine::ModeToState(ExecutionMode mode) const
    {
        switch (mode)
        {
        case ExecutionMode::AutoProfilingInterpreter:
            return ExecutionState::AutoProfilingInterpreter0;

        case ExecutionMode::ProfilingInterpreter:
            return ExecutionState::ProfilingInterpreter0;

        case ExecutionMode::SimpleJit:
            return ExecutionState::SimpleJit;

        case ExecutionMode::FullJit:
            return ExecutionState::FullJit;

        default:
            Assert(!"Unexpected ExecutionMode for ExecutionState");
            // fall through
        case ExecutionMode::Interpreter:
            return ExecutionState::Interpreter;
        }
    }